

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZWavyLine.cpp
# Opt level: O0

void pzgeom::TPZWavyLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  long *plVar4;
  TPZWavyLine *this;
  TPZGeoNode *wavedir_00;
  TPZAdmChunkVector<TPZGeoNode,_10> *pTVar5;
  TPZVec<long> *nodeindices;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *this_00;
  TPZGeoMesh *mesh;
  TPZGeoElRefLess<pzgeom::TPZWavyLine> *this_01;
  TPZManVector<long,_10> *this_02;
  TPZVec<double> *in_RCX;
  TPZGeoMesh *in_RDI;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *gel;
  TPZManVector<long,_10> nodind;
  int numwaves;
  TPZManVector<double,_3> wavedir;
  TPZManVector<double,_3> x1;
  TPZManVector<double,_3> x0;
  TPZGeoMesh *in_stack_fffffffffffffdf0;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffdf8;
  TPZGeoNode *in_stack_fffffffffffffe00;
  int64_t in_stack_fffffffffffffe08;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffe10;
  int64_t in_stack_fffffffffffffe18;
  TPZManVector<double,_3> *in_stack_fffffffffffffe20;
  TPZVec<double> *in_stack_fffffffffffffe28;
  TPZManVector<double,_3> *in_stack_fffffffffffffe30;
  int numwaves_00;
  TPZVec<long> local_158 [3];
  undefined4 local_e4;
  undefined8 local_e0;
  TPZVec<double> local_d8 [2];
  TPZVec<double> local_90;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  TPZGeoMesh *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_e0 = 0;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(double *)in_stack_fffffffffffffe10
            );
  pdVar3 = TPZVec<double>::operator[](&local_58,0);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](&local_90,0);
  *pdVar3 = dVar1 + 2.0;
  pdVar3 = TPZVec<double>::operator[](local_d8,1);
  *pdVar3 = 1.0;
  local_e4 = 4;
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  TPZGeoMesh::NodeVec(local_8);
  iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffdf8);
  plVar4 = TPZVec<long>::operator[](local_158,0);
  *plVar4 = (long)iVar2;
  TPZGeoMesh::NodeVec(local_8);
  this = (TPZWavyLine *)TPZVec<long>::operator[](local_158,0);
  wavedir_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  TPZGeoNode::Initialize
            (in_stack_fffffffffffffe00,(TPZVec<double> *)in_stack_fffffffffffffdf8,
             in_stack_fffffffffffffdf0);
  pTVar5 = TPZGeoMesh::NodeVec(local_8);
  numwaves_00 = (int)((ulong)pTVar5 >> 0x20);
  iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffdf8);
  nodeindices = (TPZVec<long> *)(long)iVar2;
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZWavyLine> *)TPZVec<long>::operator[](local_158,1);
  *(TPZVec<long> **)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).super_TPZGeoEl =
       nodeindices;
  pTVar5 = TPZGeoMesh::NodeVec(local_8);
  iVar2 = (int)((ulong)pTVar5 >> 0x20);
  mesh = (TPZGeoMesh *)TPZVec<long>::operator[](local_158,1);
  TPZChunkVector<TPZGeoNode,_10>::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  TPZGeoNode::Initialize
            (in_stack_fffffffffffffe00,(TPZVec<double> *)in_stack_fffffffffffffdf8,
             in_stack_fffffffffffffdf0);
  this_01 = (TPZGeoElRefLess<pzgeom::TPZWavyLine> *)operator_new(0x108);
  TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern(this_00,nodeindices,iVar2,mesh);
  pdVar3 = TPZVec<double>::operator[](local_20,0);
  *pdVar3 = 2.0;
  pdVar3 = TPZVec<double>::operator[](local_20,1);
  *pdVar3 = 2.0;
  this_02 = (TPZManVector<long,_10> *)TPZGeoElRefLess<pzgeom::TPZWavyLine>::Geom(this_01);
  SetData(this,(TPZVec<double> *)wavedir_00,numwaves_00);
  TPZManVector<long,_10>::~TPZManVector(this_02);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_02);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_02);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_02);
  return;
}

Assistant:

void TPZWavyLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<REAL,3> x0(lowercorner), x1(lowercorner), wavedir(3,0.);
        x1[0] = x0[0]+2.;
        wavedir[1] = 1.;
        int numwaves = 4;
        TPZManVector<int64_t> nodind(2);
        nodind[0] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodind[0]].Initialize(x0, gmesh);
        nodind[1] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodind[1]].Initialize(x1, gmesh);
        
        TPZGeoElRefPattern<TPZWavyLine> *gel = new TPZGeoElRefPattern<TPZWavyLine> (nodind,matid,gmesh);
        size[0] = 2.;
        size[1] = 2.;
        gel->Geom().SetData(wavedir, numwaves);
       
    }